

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportGlobal
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index global_index,Type type,bool mutable_)

{
  size_type *this_00;
  Module *this_01;
  undefined1 local_80 [8];
  string_view module_name_local;
  undefined1 local_50 [8];
  string_view field_name_local;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_38;
  
  field_name_local.data_ = (char *)field_name.size_;
  local_50 = (undefined1  [8])field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  local_80 = (undefined1  [8])module_name.data_;
  MakeUnique<wabt::GlobalImport>();
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_80);
  this_00 = &module_name_local.size_;
  std::__cxx11::string::operator=((string *)(field_name_local.size_ + 8),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  string_view::to_string_abi_cxx11_((string *)&module_name_local.size_,(string_view *)local_50);
  std::__cxx11::string::operator=((string *)(field_name_local.size_ + 0x28),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  *(Type *)(field_name_local.size_ + 0x70) = type;
  *(bool *)(field_name_local.size_ + 0x74) = mutable_;
  this_01 = this->module_;
  GetLocation((Location *)&module_name_local.size_,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
            ((wabt *)&local_38,
             (unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
             &field_name_local.size_,(Location *)&module_name_local.size_);
  Module::AppendField(this_01,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_38);
  if (local_38._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
      0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       0x0;
  if (field_name_local.size_ != 0) {
    (**(code **)(*(long *)field_name_local.size_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportGlobal(Index import_index,
                                      string_view module_name,
                                      string_view field_name,
                                      Index global_index,
                                      Type type,
                                      bool mutable_) {
  auto import = MakeUnique<GlobalImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->global.type = type;
  import->global.mutable_ = mutable_;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}